

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

void __thiscall
ImVector<ImGuiPtrOrIndex>::push_back(ImVector<ImGuiPtrOrIndex> *this,ImGuiPtrOrIndex *v)

{
  ImGuiPtrOrIndex *pIVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  int new_capacity;
  
  iVar4 = this->Size;
  if (iVar4 == this->Capacity) {
    if (iVar4 == 0) {
      iVar3 = 8;
    }
    else {
      iVar3 = iVar4 / 2 + iVar4;
    }
    new_capacity = iVar4 + 1;
    if (iVar4 + 1 < iVar3) {
      new_capacity = iVar3;
    }
    reserve(this,new_capacity);
    iVar4 = this->Size;
  }
  iVar3 = v->Index;
  uVar2 = *(undefined4 *)&v->field_0xc;
  pIVar1 = this->Data + iVar4;
  pIVar1->Ptr = v->Ptr;
  pIVar1->Index = iVar3;
  *(undefined4 *)&pIVar1->field_0xc = uVar2;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_back(const T& v)               { if (Size == Capacity) reserve(_grow_capacity(Size + 1)); memcpy(&Data[Size], &v, sizeof(v)); Size++; }